

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

void __thiscall
Js::JavascriptBigInt::MulThenAdd(JavascriptBigInt *this,digit_t digitMul,digit_t digitAdd)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  Type TVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (digitMul == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x166,"(digitMul != 0)","digitMul != 0");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  puVar7 = (this->m_digits).ptr;
  puVar1 = puVar7 + this->m_length;
  if (puVar7 < puVar1) {
    do {
      uVar10 = *puVar7 & 0xffffffff;
      uVar9 = *puVar7 >> 0x20;
      uVar12 = uVar10 * (digitMul & 0xffffffff);
      uVar10 = uVar10 * (digitMul >> 0x20);
      uVar8 = uVar9 * (digitMul & 0xffffffff);
      uVar14 = uVar10 << 0x20;
      uVar11 = ((ulong)(uint)((int)uVar10 + (int)uVar8) << 0x20) + uVar12;
      uVar13 = (ulong)CARRY8(uVar14,uVar12) + 1;
      if (uVar14 + uVar12 <= uVar11) {
        uVar13 = (ulong)CARRY8(uVar14,uVar12);
      }
      uVar12 = uVar11 + digitAdd;
      digitAdd = (ulong)(CARRY8(uVar11,digitAdd) && digitAdd != 0) +
                 (uVar8 >> 0x20) + uVar9 * (digitMul >> 0x20) + (uVar10 >> 0x20) + uVar13;
      *puVar7 = uVar12;
      puVar7 = puVar7 + 1;
    } while (puVar7 < puVar1);
  }
  if (digitAdd != 0) {
    if (this->m_maxLength <= this->m_length) {
      Resize(this,this->m_length + 1);
    }
    puVar2 = (this->m_digits).ptr;
    TVar3 = this->m_length;
    this->m_length = TVar3 + 1;
    puVar2[TVar3] = digitAdd;
  }
  return;
}

Assistant:

void JavascriptBigInt::MulThenAdd(digit_t digitMul, digit_t digitAdd)
    {
        Assert(digitMul != 0);

        digit_t carryDigit = 0;
        digit_t *pDigit = m_digits;
        digit_t *pDigitLimit = pDigit + m_length;

        for (; pDigit < pDigitLimit; pDigit++)
        {
            *pDigit = JavascriptBigInt::MulDigit(*pDigit, digitMul, &carryDigit);// return low Digit to digit, hight Digit to carry
            if (digitAdd > 0)
            {
                *pDigit = JavascriptBigInt::AddDigit(*pDigit, digitAdd, &carryDigit);// add carry to result
            }
            digitAdd = carryDigit;
        }
        if (0 < digitAdd) // length increase by 1
        {
            if (m_length >= m_maxLength)
            {
                Resize(m_length + 1);
            }
            m_digits[m_length++] = digitAdd;
        }
    }